

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfEnvmap.cpp
# Opt level: O3

V2f __thiscall Imf_3_4::LatLongMap::latLong(LatLongMap *this,V3f *dir)

{
  V2f VVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float extraout_XMM0_Db;
  float fVar6;
  float fVar7;
  
  fVar4 = dir->y;
  fVar7 = dir->x * dir->x;
  fVar6 = dir->z * dir->z;
  fVar3 = fVar4 * fVar4 + fVar7 + fVar6;
  fVar6 = SQRT(fVar6 + fVar7);
  if (ABS(fVar4) <= fVar6) {
    if (fVar3 < 2.3509887e-38) {
      fVar3 = Imath_3_2::Vec3<float>::lengthTiny(dir);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    fVar4 = asinf(fVar4 / fVar3);
  }
  else {
    if (fVar3 < 2.3509887e-38) {
      fVar3 = Imath_3_2::Vec3<float>::lengthTiny(dir);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    fVar4 = acosf(fVar6 / fVar3);
    uVar2 = -(uint)(0.0 < dir->y);
    fVar4 = (float)(uVar2 & 0x3f800000 | ~uVar2 & -(uint)(dir->y < 0.0) & 0xbf800000) * fVar4;
  }
  fVar3 = dir->x;
  fVar6 = dir->z;
  fVar5 = 0.0;
  fVar7 = 0.0;
  if ((((fVar6 != 0.0) || (NAN(fVar6))) || (fVar3 != 0.0)) || (NAN(fVar3))) {
    fVar5 = atan2f(fVar3,fVar6);
    fVar7 = extraout_XMM0_Db;
  }
  *(float *)this = fVar4;
  *(float *)(this + 4) = fVar5;
  VVar1.y = fVar7;
  VVar1.x = fVar5;
  return VVar1;
}

Assistant:

V2f
latLong (const V3f& dir)
{
    float r = sqrt (dir.z * dir.z + dir.x * dir.x);

    float latitude = (r < abs (dir.y)) ? acos (r / dir.length ()) * sign (dir.y)
                                       : asin (dir.y / dir.length ());

    float longitude = (dir.z == 0 && dir.x == 0) ? 0 : atan2 (dir.x, dir.z);

    return V2f (latitude, longitude);
}